

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# algorithm.hpp
# Opt level: O2

unsigned_long *
boost::detail::multi_array::copy_n<long*,unsigned_long,unsigned_long*>
          (long *first,unsigned_long count,unsigned_long *result)

{
  unsigned_long uVar1;
  
  for (uVar1 = 0; count != uVar1; uVar1 = uVar1 + 1) {
    *result = first[uVar1];
    result = result + 1;
  }
  return result;
}

Assistant:

OutputIter copy_n(InputIter first, Size count,
                  OutputIter result) {
  for ( ; count > 0; --count) {
    *result = *first;
    ++first;
    ++result;
  }
  return result;
}